

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unidim-lipm-dcm-estimator.cpp
# Opt level: O0

void __thiscall
stateObservation::UnidimLipmDcmEstimator::setUnbiasedDCM
          (UnidimLipmDcmEstimator *this,double dcm,double uncertainty)

{
  Scalar *pSVar1;
  double dVar2;
  Matrix<double,__1,__1,_0,__1,__1> local_88;
  Matrix<double,__1,__1,_0,__1,__1> local_60;
  Matrix<double,2,2,0,2,2> local_48 [8];
  Matrix2 P;
  double local_20;
  double uncertainty_local;
  double dcm_local;
  UnidimLipmDcmEstimator *this_local;
  
  local_20 = uncertainty;
  uncertainty_local = dcm;
  dcm_local = (double)this;
  setUnbiasedDCM(this,dcm);
  KalmanFilterBase::getStateCovariance((Pmatrix *)&local_60,&(this->filter_).super_KalmanFilterBase)
  ;
  Eigen::Matrix<double,2,2,0,2,2>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_48,(EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_60);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_60);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)local_48,1,0);
  *pSVar1 = 0.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)local_48,0,1);
  *pSVar1 = 0.0;
  dVar2 = tools::square<double>(&local_20);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)local_48,0,0);
  *pSVar1 = dVar2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,2,0,2,2>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_88,
             (EigenBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_48);
  KalmanFilterBase::setStateCovariance(&(this->filter_).super_KalmanFilterBase,(Pmatrix *)&local_88)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_88);
  return;
}

Assistant:

void UnidimLipmDcmEstimator::setUnbiasedDCM(double dcm, double uncertainty)
{
  setUnbiasedDCM(dcm);
  Matrix2 P = filter_.getStateCovariance();
  /// resetting the non diagonal parts
  P(0, 1) = P(1, 0) = 0;
  P(0, 0) = square(uncertainty);
  filter_.setStateCovariance(P);
}